

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O0

void __thiscall libtorrent::aux::merkle_tree::optimize_storage_piece_layer(merkle_tree *this)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  span<const_libtorrent::digest32<256L>_> tree;
  bool local_b9;
  allocator<libtorrent::digest32<256L>_> local_99;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_98;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_90;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_88;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_80;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_78;
  undefined1 local_70 [8];
  vector<sha256_hash> new_tree;
  int start;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_48;
  digest32<256L> *local_40;
  span<const_libtorrent::digest32<256L>_> local_38;
  span<const_libtorrent::digest32<256L>_> local_28;
  int local_14;
  merkle_tree *pmStack_10;
  int piece_layer_size;
  merkle_tree *this_local;
  
  if (this->m_mode == full_tree) {
    pmStack_10 = this;
    iVar2 = num_pieces(this);
    local_14 = merkle_num_leafs(iVar2);
    local_b9 = false;
    if (this->m_blocks_per_piece_log != '\0') {
      span<libtorrent::digest32<256l>const>::
      span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
                ((span<libtorrent::digest32<256l>const> *)&local_38,&this->m_tree);
      iVar2 = merkle_num_nodes(local_14);
      local_28 = span<const_libtorrent::digest32<256L>_>::subspan(&local_38,0,(long)iVar2);
      tree.m_len = (digest32<256L> *)local_28.m_len;
      tree.m_ptr = tree.m_len;
      bVar1 = merkle_validate_single_layer((libtorrent *)local_28.m_ptr,tree);
      local_b9 = false;
      if (bVar1) {
        local_48._M_current =
             (digest32<256L> *)
             ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ::begin(&(this->m_tree).
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    );
        iVar2 = block_layer_start(this);
        local_40 = (digest32<256L> *)
                   __gnu_cxx::
                   __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                   ::operator+(&local_48,(long)iVar2);
        iVar3 = ::std::
                vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                end(&(this->m_tree).
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   );
        local_b9 = ::std::
                   all_of<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::aux::merkle_tree::optimize_storage_piece_layer()::__0>
                             (local_40,iVar3._M_current);
      }
    }
    if (local_b9 != false) {
      new_tree.
      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = piece_layer_start(this);
      local_80._M_current =
           (digest32<256L> *)
           ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
           begin(&(this->m_tree).
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                );
      local_78 = __gnu_cxx::
                 __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                 ::operator+(&local_80,
                             (long)(int)new_tree.
                                        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        .
                                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_98._M_current =
           (digest32<256L> *)
           ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
           begin(&(this->m_tree).
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                );
      local_90 = __gnu_cxx::
                 __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                 ::operator+(&local_98,
                             (long)(int)new_tree.
                                        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        .
                                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar2 = num_pieces(this);
      local_88 = __gnu_cxx::
                 __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                 ::operator+(&local_90,(long)iVar2);
      ::std::allocator<libtorrent::digest32<256L>_>::allocator(&local_99);
      container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
      ::
      container_wrapper<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,void>
                ((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                  *)local_70,local_78,local_88,&local_99);
      ::std::allocator<libtorrent::digest32<256L>_>::~allocator(&local_99);
      container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
      ::operator=(&this->m_tree,
                  (container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                   *)local_70);
      this->m_mode = piece_layer;
      bitfield::clear(&this->m_block_verified);
      container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
      ::~container_wrapper
                ((container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                  *)local_70);
    }
  }
  return;
}

Assistant:

void merkle_tree::optimize_storage_piece_layer()
	{
		INVARIANT_CHECK;
		if (m_mode != mode_t::full_tree) return;

		// if we have *any* blocks, we can't transition into piece layer mode,
		// since we would lose those hashes
		int const piece_layer_size = merkle_num_leafs(num_pieces());
		if (m_blocks_per_piece_log > 0
			&& merkle_validate_single_layer(span<sha256_hash const>(m_tree).subspan(0, merkle_num_nodes(piece_layer_size)))
			&& std::all_of(m_tree.begin() + block_layer_start(), m_tree.end(), [](sha256_hash const& h) { return h.is_all_zeros(); })
			)
		{
			int const start = piece_layer_start();
			aux::vector<sha256_hash> new_tree(m_tree.begin() + start, m_tree.begin() + start + num_pieces());

			m_tree = std::move(new_tree);
			m_mode = mode_t::piece_layer;
			m_block_verified.clear();
			return;
		}
	}